

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitplane.cpp
# Opt level: O2

bool ConvexDecomposition::computeSplitPlane
               (uint vcount,float *vertices,uint tcount,uint *indices,
               ConvexDecompInterface *callback,float *plane)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  float fVar13;
  float fVar14;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [64];
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar10 [16];
  undefined1 auVar15 [16];
  
  auVar10._8_4_ = 0x4e6e6b28;
  auVar10._0_8_ = 0x4e6e6b284e6e6b28;
  auVar10._12_4_ = 0x4e6e6b28;
  auVar15._8_4_ = 0xce6e6b28;
  auVar15._0_8_ = 0xce6e6b28ce6e6b28;
  auVar15._12_4_ = 0xce6e6b28;
  auVar12 = ZEXT464(0x4e6e6b28);
  auVar20 = ZEXT464(0xce6e6b28);
  uVar7 = 0;
  while( true ) {
    fVar13 = auVar15._0_4_;
    fVar9 = auVar10._0_4_;
    auVar11 = auVar12._0_16_;
    if ((ulong)vcount * 3 == uVar7) break;
    uVar8 = uVar7 & 0xffffffff;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *(ulong *)(vertices + uVar8 + 1);
    uVar7 = uVar7 + 3;
    auVar11 = vminss_avx(ZEXT416((uint)vertices[uVar8]),auVar11);
    auVar12 = ZEXT1664(auVar11);
    auVar11 = vmaxss_avx(ZEXT416((uint)vertices[uVar8]),auVar20._0_16_);
    auVar20 = ZEXT1664(auVar11);
    auVar10 = vminps_avx(auVar18,auVar10);
    auVar15 = vmaxps_avx(auVar18,auVar15);
  }
  auVar2 = vsubps_avx(auVar15,auVar10);
  fVar3 = auVar20._0_4_ - auVar12._0_4_;
  auVar18 = vmovshdup_avx(auVar2);
  fVar23 = auVar2._0_4_;
  uVar7 = vcmpps_avx512vl(ZEXT416((uint)fVar3),auVar18,1);
  uVar8 = vcmpps_avx512vl(auVar2,auVar18,1);
  auVar1 = vmovshdup_avx(auVar10);
  fVar21 = auVar1._0_4_;
  cVar6 = '\x02';
  if ((uVar7 & uVar8 & 1) == 0) {
    cVar6 = fVar3 < fVar23;
  }
  auVar17 = SUB6416(ZEXT464(0x3f000000),0);
  auVar5 = vfmadd213ss_fma(auVar17,ZEXT416((uint)fVar3),auVar11);
  auVar10 = vfmadd213ss_fma(auVar17,auVar2,auVar10);
  auVar2 = vfmadd213ss_fma(auVar17,auVar18,auVar1);
  fVar19 = auVar10._0_4_;
  fVar16 = auVar2._0_4_;
  if (cVar6 == '\0') {
    if (auVar18._0_4_ <= fVar23) {
      auVar1 = vmovshdup_avx(auVar15);
      fVar13 = fVar9;
    }
    auVar12 = ZEXT1664(auVar5);
    auVar20 = ZEXT1664(auVar5);
    fVar14 = fVar13;
    fVar22 = auVar1._0_4_;
  }
  else if (cVar6 == '\x01') {
    fVar14 = fVar19;
    fVar22 = fVar21;
    fVar9 = fVar19;
    if (fVar3 <= auVar18._0_4_) {
      auVar15 = vmovshdup_avx(auVar15);
      auVar20 = ZEXT1664(auVar11);
      fVar22 = auVar15._0_4_;
    }
  }
  else {
    fVar14 = fVar9;
    fVar22 = fVar16;
    fVar21 = fVar16;
    if (fVar3 <= fVar23) {
      auVar20 = ZEXT1664(auVar11);
      fVar14 = fVar13;
    }
  }
  fVar13 = auVar12._0_4_ - auVar20._0_4_;
  fVar3 = auVar5._0_4_ - auVar12._0_4_;
  auVar10 = vfmsub231ss_fma(ZEXT416((uint)((fVar21 - fVar22) * (fVar19 - fVar9))),
                            ZEXT416((uint)(fVar9 - fVar14)),ZEXT416((uint)(fVar16 - fVar21)));
  auVar15 = vfmsub231ss_fma(ZEXT416((uint)((fVar16 - fVar21) * fVar13)),ZEXT416((uint)fVar3),
                            ZEXT416((uint)(fVar21 - fVar22)));
  auVar11 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * (fVar9 - fVar14))),ZEXT416((uint)fVar13),
                            ZEXT416((uint)(fVar19 - fVar9)));
  fVar21 = auVar15._0_4_;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar21)),auVar10,auVar10);
  auVar15 = vfmadd231ss_fma(auVar15,auVar11,auVar11);
  auVar15 = vsqrtss_avx(auVar15,auVar15);
  uVar4 = vcmpss_avx512f(auVar15,ZEXT416(0x358637bd),1);
  fVar3 = (float)((uint)!(bool)((byte)uVar4 & 1) * (int)(1.0 / auVar15._0_4_));
  fVar13 = auVar10._0_4_ * fVar3;
  fVar9 = auVar11._0_4_ * fVar3;
  *plane = fVar13;
  plane[1] = fVar21 * fVar3;
  plane[2] = fVar9;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar21 * fVar3)),ZEXT416((uint)fVar13),auVar5);
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar9),auVar2);
  plane[3] = 0.0 - auVar15._0_4_;
  return true;
}

Assistant:

bool computeSplitPlane(unsigned int vcount,
                       const float *vertices,
                       unsigned int tcount,
                       const unsigned int *indices,
                       ConvexDecompInterface *callback,
                       float *plane)
{
  float bmin[3] = { 1e9, 1e9, 1e9 };
  float bmax[3] = { -1e9, -1e9, -1e9 };

 	for (unsigned int i=0; i<vcount; i++)
 	{
    const float *p = &vertices[i*3];

 		if ( p[0] < bmin[0] ) bmin[0] = p[0];
 		if ( p[1] < bmin[1] ) bmin[1] = p[1];
 		if ( p[2] < bmin[2] ) bmin[2] = p[2];

 		if ( p[0] > bmax[0] ) bmax[0] = p[0];
 		if ( p[1] > bmax[1] ) bmax[1] = p[1];
 		if ( p[2] > bmax[2] ) bmax[2] = p[2];

  }

  float dx = bmax[0] - bmin[0];
  float dy = bmax[1] - bmin[1];
  float dz = bmax[2] - bmin[2];


	float laxis = dx;

	unsigned int axis = 0;

	if ( dy > dx )
	{
		axis = 1;
		laxis = dy;
	}

	if ( dz > dx && dz > dy )
	{
		axis = 2;
		laxis = dz;
	}

  float p1[3];
  float p2[3];
  float p3[3];

  p3[0] = p2[0] = p1[0] = bmin[0] + dx*0.5f;
  p3[1] = p2[1] = p1[1] = bmin[1] + dy*0.5f;
  p3[2] = p2[2] = p1[2] = bmin[2] + dz*0.5f;

  Rect3d b(bmin,bmax);

  Rect3d b1,b2;

  splitRect(axis,b,b1,b2,p1);


//  callback->ConvexDebugBound(b1.mMin,b1.mMax,0x00FF00);
//  callback->ConvexDebugBound(b2.mMin,b2.mMax,0xFFFF00);

  switch ( axis )
  {
    case 0:
      p2[1] = bmin[1];
      p2[2] = bmin[2];

      if ( dz > dy )
      {
        p3[1] = bmax[1];
        p3[2] = bmin[2];
      }
      else
      {
        p3[1] = bmin[1];
        p3[2] = bmax[2];
      }

      break;
    case 1:
      p2[0] = bmin[0];
      p2[2] = bmin[2];

      if ( dx > dz )
      {
        p3[0] = bmax[0];
        p3[2] = bmin[2];
      }
      else
      {
        p3[0] = bmin[0];
        p3[2] = bmax[2];
      }

      break;
    case 2:
      p2[0] = bmin[0];
      p2[1] = bmin[1];

      if ( dx > dy )
      {
        p3[0] = bmax[0];
        p3[1] = bmin[1];
      }
      else
      {
        p3[0] = bmin[0];
        p3[1] = bmax[1];
      }

      break;
  }

//  callback->ConvexDebugTri(p1,p2,p3,0xFF0000);

	computePlane(p1,p2,p3,plane);

  return true;

}